

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i386.h
# Opt level: O0

OpCode i386::parse_opcode(Type t,string *o)

{
  bool bVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *o_local;
  Type t_local;
  
  if (t == Label) {
    return unknown;
  }
  local_18 = o;
  o_local._0_4_ = t;
  if (t == Instruction) {
    bVar1 = std::operator==(o,"movzwl");
    if (bVar1) {
      return movzwl;
    }
    bVar1 = std::operator==(local_18,"movzbl");
    if (bVar1) {
      return movzbl;
    }
    bVar1 = std::operator==(local_18,"shrb");
    if (bVar1) {
      return shrb;
    }
    bVar1 = std::operator==(local_18,"shrl");
    if (bVar1) {
      return shrl;
    }
    bVar1 = std::operator==(local_18,"xorl");
    if (bVar1) {
      return xorl;
    }
    bVar1 = std::operator==(local_18,"andl");
    if (bVar1) {
      return andl;
    }
    bVar1 = std::operator==(local_18,"ret");
    if (bVar1) {
      return ret;
    }
    bVar1 = std::operator==(local_18,"movb");
    if (bVar1) {
      return movb;
    }
    bVar1 = std::operator==(local_18,"cmpb");
    if (bVar1) {
      return cmpb;
    }
    bVar1 = std::operator==(local_18,"movl");
    if (bVar1) {
      return movl;
    }
    bVar1 = std::operator==(local_18,"jmp");
    if (bVar1) {
      return jmp;
    }
    bVar1 = std::operator==(local_18,"testb");
    if (bVar1) {
      return testb;
    }
    bVar1 = std::operator==(local_18,"incl");
    if (bVar1) {
      return incl;
    }
    bVar1 = std::operator==(local_18,"sarl");
    if (bVar1) {
      return sarl;
    }
    bVar1 = std::operator==(local_18,"decl");
    if (bVar1) {
      return decl;
    }
    bVar1 = std::operator==(local_18,"jne");
    if (bVar1) {
      return jne;
    }
    bVar1 = std::operator==(local_18,"je");
    if (bVar1) {
      return je;
    }
    bVar1 = std::operator==(local_18,"js");
    if (bVar1) {
      return js;
    }
    bVar1 = std::operator==(local_18,"subl");
    if (bVar1) {
      return subl;
    }
    bVar1 = std::operator==(local_18,"subb");
    if (bVar1) {
      return subb;
    }
    bVar1 = std::operator==(local_18,"addl");
    if (bVar1) {
      return addl;
    }
    bVar1 = std::operator==(local_18,"addb");
    if (bVar1) {
      return addb;
    }
    bVar1 = std::operator==(local_18,"sall");
    if (bVar1) {
      return sall;
    }
    bVar1 = std::operator==(local_18,"orl");
    if (bVar1) {
      return orl;
    }
    bVar1 = std::operator==(local_18,"andb");
    if (bVar1) {
      return andb;
    }
    bVar1 = std::operator==(local_18,"orb");
    if (bVar1) {
      return orb;
    }
    bVar1 = std::operator==(local_18,"decb");
    if (bVar1) {
      return decb;
    }
    bVar1 = std::operator==(local_18,"incb");
    if (bVar1) {
      return incb;
    }
    bVar1 = std::operator==(local_18,"rep");
    if (bVar1) {
      return rep;
    }
    bVar1 = std::operator==(local_18,"notb");
    if (bVar1) {
      return notb;
    }
    bVar1 = std::operator==(local_18,"negb");
    if (bVar1) {
      return negb;
    }
    bVar1 = std::operator==(local_18,"sbbb");
    if (bVar1) {
      return sbbb;
    }
    bVar1 = std::operator==(local_18,"pushl");
    if (bVar1) {
      return pushl;
    }
    bVar1 = std::operator==(local_18,"popl");
    if (bVar1) {
      return popl;
    }
    bVar1 = std::operator==(local_18,"retl");
    if (bVar1) {
      return retl;
    }
    bVar1 = std::operator==(local_18,"callw");
    if (bVar1) {
      return callw;
    }
    bVar1 = std::operator==(local_18,"calll");
    if (bVar1) {
      return calll;
    }
    bVar1 = std::operator==(local_18,"movw");
    if (bVar1) {
      return movw;
    }
    bVar1 = std::operator==(local_18,"hlt");
    if (bVar1) {
      return hlt;
    }
  }
  else if (t == Directive || t == Comment) {
    return unknown;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"Unknown opcode: ",local_18);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static OpCode parse_opcode(Type t, const std::string& o) {
		switch (t) {
			case Type::Label:
			case Type::Comment:
			case Type::Directive:
				return OpCode::unknown;
			case Type::Instruction: {
				if (o == "movzwl")
					return OpCode::movzwl;
				if (o == "movzbl")
					return OpCode::movzbl;
				if (o == "shrb")
					return OpCode::shrb;
				if (o == "shrl")
					return OpCode::shrl;
				if (o == "xorl")
					return OpCode::xorl;
				if (o == "andl")
					return OpCode::andl;
				if (o == "ret")
					return OpCode::ret;
				if (o == "movb")
					return OpCode::movb;
				if (o == "cmpb")
					return OpCode::cmpb;
				if (o == "movl")
					return OpCode::movl;
				if (o == "jmp")
					return OpCode::jmp;
				if (o == "testb")
					return OpCode::testb;
				if (o == "incl")
					return OpCode::incl;
				if (o == "sarl")
					return OpCode::sarl;
				if (o == "decl")
					return OpCode::decl;
				if (o == "jne")
					return OpCode::jne;
				if (o == "je")
					return OpCode::je;
				if (o == "js")
					return OpCode::js;
				if (o == "subl")
					return OpCode::subl;
				if (o == "subb")
					return OpCode::subb;
				if (o == "addl")
					return OpCode::addl;
				if (o == "addb")
					return OpCode::addb;
				if (o == "sall")
					return OpCode::sall;
				if (o == "orl")
					return OpCode::orl;
				if (o == "andb")
					return OpCode::andb;
				if (o == "orb")
					return OpCode::orb;
				if (o == "decb")
					return OpCode::decb;
				if (o == "incb")
					return OpCode::incb;
				if (o == "rep")
					return OpCode::rep;
				if (o == "notb")
					return OpCode::notb;
				if (o == "negb")
					return OpCode::negb;
				if (o == "sbbb")
					return OpCode::sbbb;
				if (o == "pushl")
					return OpCode::pushl;
				if (o == "popl")
					return OpCode::popl;
				if (o == "retl")
					return OpCode::retl;
				if (o == "callw")
					return OpCode::callw;
				if (o == "calll")
					return OpCode::calll;
				if (o == "movw")
					return OpCode::movw;
				if (o == "hlt")
					return OpCode::hlt;
			}
		}
		throw std::runtime_error("Unknown opcode: " + o);
	}